

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall trompeloeil::sequence_matcher::retire_predecessors(sequence_matcher *this)

{
  sequence_matcher *this_local;
  
  sequence_type::retire_until(*(sequence_type **)(this + 0x40),this);
  return;
}

Assistant:

void
    retire_predecessors()
    noexcept
    {
      seq.retire_until(this);
    }